

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.h
# Opt level: O2

string * __thiscall
ExprEval::Operator::Specification::get_symbol_abi_cxx11_
          (string *__return_storage_ptr__,Specification *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->symbol);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string get_symbol() const{ return symbol; }